

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams
          (InnerProductLayerParams *this,InnerProductLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  uint64 uVar3;
  bool bVar4;
  WeightParams *pWVar5;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__InnerProductLayerParams_003bb840
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (InnerProductLayerParams *)&_InnerProductLayerParams_default_instance_) {
    pWVar5 = (WeightParams *)0x0;
  }
  else {
    pWVar5 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar5,pWVar2);
  }
  this->weights_ = pWVar5;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (InnerProductLayerParams *)&_InnerProductLayerParams_default_instance_) {
    pWVar5 = (WeightParams *)0x0;
  }
  else {
    pWVar5 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar5,pWVar2);
  }
  this->bias_ = pWVar5;
  uVar3 = from->outputchannels_;
  this->inputchannels_ = from->inputchannels_;
  this->outputchannels_ = uVar3;
  bVar4 = from->int8dynamicquantize_;
  this->hasbias_ = from->hasbias_;
  this->int8dynamicquantize_ = bVar4;
  return;
}

Assistant:

InnerProductLayerParams::InnerProductLayerParams(const InnerProductLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&inputchannels_, &from.inputchannels_,
    reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&inputchannels_) + sizeof(int8dynamicquantize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.InnerProductLayerParams)
}